

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O3

int __thiscall Epoll::create_epool(Epoll *this,int max_fd)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  epoll_event *peVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auStack_2c [12];
  undefined8 uStack_20;
  
  uVar5 = (ulong)(uint)max_fd;
  this->_maxevents = max_fd;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max_fd;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar6 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  uStack_20 = (Epoll *)0x101c10;
  peVar4 = (epoll_event *)operator_new__(uVar6);
  this->_events = peVar4;
  uVar6 = (ulong)(max_fd + 1U);
  uStack_20 = (Epoll *)0x101c1f;
  iVar2 = epoll_create(max_fd + 1U);
  this->_epfd = iVar2;
  if (-1 < iVar2) {
    return 0;
  }
  uStack_20 = (Epoll *)0x101c35;
  create_epool();
  auStack_2c._4_4_ = (undefined4)uVar5;
  uStack_20 = this;
  iVar2 = epoll_ctl(*(int *)(uVar6 + 0xc),1,auStack_2c._4_4_,(epoll_event *)auStack_2c);
  iVar3 = 0;
  if (iVar2 < 0) {
    add_event((Epoll *)(uVar5 & 0xffffffff));
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Epoll::create_epool(const int max_fd)
{
    _maxevents = max_fd;
    _events = new epoll_event[max_fd];
    _epfd = epoll_create(max_fd+1);
    if (_epfd < 0)
    {
        LOG_PRINT("epoll_create failed! error: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }

    return 0;
}